

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cpu.cpp
# Opt level: O0

ICpuInfo * xmrig::Cpu::info(void)

{
  ICpuInfo *pIVar1;
  HwlocCpuInfo *in_stack_00000080;
  
  if (cpuInfo == (ICpuInfo *)0x0) {
    pIVar1 = (ICpuInfo *)operator_new(0xd8);
    HwlocCpuInfo::HwlocCpuInfo(in_stack_00000080);
    cpuInfo = pIVar1;
  }
  return cpuInfo;
}

Assistant:

xmrig::ICpuInfo *xmrig::Cpu::info()
{
    if (cpuInfo == nullptr) {
#       if defined(XMRIG_FEATURE_HWLOC)
        cpuInfo = new HwlocCpuInfo();
#       elif defined(XMRIG_FEATURE_LIBCPUID)
        cpuInfo = new AdvancedCpuInfo();
#       else
        cpuInfo = new BasicCpuInfo();
#       endif
    }

    return cpuInfo;
}